

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenCADFile.cpp
# Opt level: O1

void __thiscall GenCADFile::GenCADFile(GenCADFile *this,vector<char,_std::allocator<char>_> *buf)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__GenCADFile_0022e4d8;
  p_Var1 = &(this->m_signals_cache)._M_t._M_impl.super__Rb_tree_header;
  (this->m_signals_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_signals_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->m_dimension = INCH;
  this->m_dimension_unit = 0;
  this->header_ast = (mpc_ast_t *)0x0;
  this->signals_ast = (mpc_ast_t *)0x0;
  this->devices_ast = (mpc_ast_t *)0x0;
  this->shapes_ast = (mpc_ast_t *)0x0;
  this->components_ast = (mpc_ast_t *)0x0;
  this->pads_ast = (mpc_ast_t *)0x0;
  this->padstacks_ast = (mpc_ast_t *)0x0;
  (this->m_signals_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_signals_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_signals_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->nc_counter = 0;
  bVar2 = parse_file(this,buf);
  (this->super_BRDFileBase).valid = bVar2;
  return;
}

Assistant:

GenCADFile::GenCADFile(const std::vector<char> &buf) {
	valid = parse_file(buf);
}